

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool libcellml::Units::compatible(UnitsPtr *units1,UnitsPtr *units2)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Units *this;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  UnitsPtr *units;
  UnitsPtr *units_00;
  string unit;
  UnitsMap units2Map;
  UnitsMap units1Map;
  key_type local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_60;
  
  this = (units1->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar3 = false;
  if ((this != (Units *)0x0) &&
     (bVar3 = false,
     (units2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
     (element_type *)0x0)) {
    bVar3 = isDefined(this);
    if ((bVar3) &&
       (bVar3 = isDefined((units2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr), bVar3)) {
      defineUnitsMap_abi_cxx11_((UnitsMap *)&local_60,(libcellml *)units1,units);
      defineUnitsMap_abi_cxx11_((UnitsMap *)&local_90,(libcellml *)units2,units_00);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count ==
          local_90._M_impl.super__Rb_tree_header._M_node_count) {
        p_Var1 = &local_60._M_impl.super__Rb_tree_header;
        bVar3 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
                p_Var1;
        if (!bVar3) {
          paVar2 = &local_b0.field_2;
          p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_b0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,*(long *)(p_Var6 + 1),
                       (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::find(&local_90,&local_b0);
            if ((_Rb_tree_header *)iVar5._M_node == &local_90._M_impl.super__Rb_tree_header) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != paVar2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            }
            bVar4 = areEqual(*(double *)(iVar5._M_node + 2),*(double *)(p_Var6 + 2));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (!bVar4) break;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            bVar3 = (_Rb_tree_header *)p_Var6 == p_Var1;
          } while (!bVar3);
        }
      }
      else {
        bVar3 = false;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~_Rb_tree(&local_60);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool Units::compatible(const UnitsPtr &units1, const UnitsPtr &units2)
{
    // Initial checks.
    if ((units1 == nullptr) || (units2 == nullptr)) {
        return false;
    }
    if ((!units1->isDefined()) || (!units2->isDefined())) {
        return false;
    }

    UnitsMap units1Map = defineUnitsMap(units1);
    UnitsMap units2Map = defineUnitsMap(units2);

    if (units1Map.size() == units2Map.size()) {
        for (const auto &units : units1Map) {
            std::string unit = units.first;
            auto found = units2Map.find(unit);

            if (found == units2Map.end()) {
                return false;
            }
            if (!areEqual(found->second, units.second)) {
                return false;
            }
        }

        return true;
    }

    return false;
}